

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall gl4cts::TextureViewTestGetTexParameter::deinit(TextureViewTestGetTexParameter *this)

{
  int iVar1;
  undefined4 extraout_var;
  pointer p_Var3;
  GLuint *pGVar4;
  pointer p_Var5;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  p_Var5 = (this->m_test_runs).
           super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var3 = (this->m_test_runs).
           super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var5 != p_Var3) {
    pGVar4 = &p_Var5->texture_view_object_created_from_view_to_id;
    do {
      if (pGVar4[-2] != 0) {
        (**(code **)(lVar2 + 0x480))(1,pGVar4 + -2);
        pGVar4[-2] = 0;
      }
      if (pGVar4[-1] != 0) {
        (**(code **)(lVar2 + 0x480))(1,pGVar4 + -1);
        pGVar4[-1] = 0;
      }
      if (*pGVar4 != 0) {
        (**(code **)(lVar2 + 0x480))(1,pGVar4);
        *pGVar4 = 0;
      }
      p_Var3 = (this->m_test_runs).
               super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      p_Var5 = (pointer)(pGVar4 + 3);
      pGVar4 = pGVar4 + 10;
    } while (p_Var5 != p_Var3);
  }
  p_Var5 = (this->m_test_runs).
           super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var3 != p_Var5) {
    (this->m_test_runs).
    super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
    ._M_impl.super__Vector_impl_data._M_finish = p_Var5;
  }
  return;
}

Assistant:

void TextureViewTestGetTexParameter::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Deinitialize all test runs */
	for (_test_runs_iterator it = m_test_runs.begin(); it != m_test_runs.end(); ++it)
	{
		_test_run& test_run = *it;

		if (test_run.parent_texture_object_id != 0)
		{
			gl.deleteTextures(1, &test_run.parent_texture_object_id);

			test_run.parent_texture_object_id = 0;
		}

		if (test_run.texture_view_object_created_from_immutable_to_id != 0)
		{
			gl.deleteTextures(1, &test_run.texture_view_object_created_from_immutable_to_id);

			test_run.texture_view_object_created_from_immutable_to_id = 0;
		}

		if (test_run.texture_view_object_created_from_view_to_id != 0)
		{
			gl.deleteTextures(1, &test_run.texture_view_object_created_from_view_to_id);

			test_run.texture_view_object_created_from_view_to_id = 0;
		}
	}
	m_test_runs.clear();
}